

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O2

void __thiscall
wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>::
noteExpressionOrCopy
          (StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner> *this,
          Expression *expr,HeapType type,Index index,LUBFinder *info)

{
  uintptr_t uVar1;
  bool bVar2;
  Expression *pEVar3;
  HeapType HVar4;
  Struct *pSVar5;
  Type type_00;
  HeapType local_40;
  Type local_38;
  Type noted;
  
  pEVar3 = Properties::getFallthrough
                     (expr,&((this->
                             super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
                             ).super_Pass.runner)->options,
                      (this->
                      super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
                      ).
                      super_PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
                      .
                      super_Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
                      .currModule,NoTeeBrIf);
  if ((pEVar3->type).id == (expr->type).id) {
    expr = pEVar3;
  }
  if ((((expr->_id == StructGetId) && (*(Index *)(expr + 1) == index)) &&
      (uVar1 = expr[1].type.id, *(long *)(uVar1 + 8) != 1)) &&
     (HVar4 = wasm::Type::getHeapType((Type *)(uVar1 + 8)), HVar4.id == type.id)) {
    return;
  }
  type_00.id = (expr->type).id;
  local_40.id = type.id;
  local_38.id = type_00.id;
  pSVar5 = HeapType::getStruct(&local_40);
  bVar2 = wasm::Type::isInexact
                    (&(pSVar5->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                      ._M_impl.super__Vector_impl_data._M_start[index].type);
  if (bVar2) {
    type_00 = wasm::Type::withInexactIfNoCustomDescs
                        (&local_38,
                         (FeatureSet)
                         (((this->
                           super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
                           ).
                           super_PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
                           .
                           super_Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
                          .currModule)->features).features);
    local_38 = type_00;
  }
  LUBFinder::note(info,type_00);
  return;
}

Assistant:

void
  noteExpressionOrCopy(Expression* expr, HeapType type, Index index, T& info) {
    // Look at the value falling through, if it has the exact same type
    // (otherwise, we'd need to consider both the type actually written and the
    // type of the fallthrough, somehow).
    auto* fallthrough = Properties::getFallthrough(
      expr,
      this->getPassOptions(),
      *this->getModule(),
      static_cast<SubType*>(this)->getFallthroughBehavior());
    if (fallthrough->type == expr->type) {
      expr = fallthrough;
    }
    if (auto* get = expr->dynCast<StructGet>()) {
      if (get->index == index && get->ref->type != Type::unreachable &&
          get->ref->type.getHeapType() == type) {
        static_cast<SubType*>(this)->noteCopy(type, index, info);
        return;
      }
    }
    static_cast<SubType*>(this)->noteExpression(expr, type, index, info);
  }